

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QString,QByteArray>::tryEmplace_impl<QString_const&>
          (QHash<QString,_QByteArray> *this,QString *key)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *d;
  size_t bucket_00;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *pDVar3;
  long *in_RSI;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QString,_QByteArray> detachGuard;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffff28;
  Node<QString,_QByteArray> *in_stack_ffffffffffffff30;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *in_stack_ffffffffffffff38;
  QHash<QString,_QByteArray> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *this_00;
  Bucket local_30;
  Bucket local_20;
  QHash<QString,_QByteArray> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*in_RSI == 0) {
    QHash<QString,_QByteArray>::detach((QHash<QString,_QByteArray> *)in_stack_ffffffffffffff30);
  }
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QString,_QByteArray>::QHash(&local_10);
  d = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)
      QHashPrivate::calculateHash<QString>
                (&in_stack_ffffffffffffff30->key,(size_t)in_stack_ffffffffffffff28);
  local_20.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::
             findBucketWithHash<QString>(this_00,(QString *)in_RDI,(size_t)d);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::Bucket::isUnused
                    ((Bucket *)0x795667);
  bVar2 = QHash<QString,_QByteArray>::isDetached
                    ((QHash<QString,_QByteArray> *)in_stack_ffffffffffffff30);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::shouldGrow
                                   ((Data<QHashPrivate::Node<QString,_QByteArray>_> *)*in_RSI),
                bVar2)))) {
    QHash<QString,_QByteArray>::operator=
              (in_stack_ffffffffffffff40,(QHash<QString,_QByteArray> *)in_stack_ffffffffffffff38);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::shouldGrow
                        ((Data<QHashPrivate::Node<QString,_QByteArray>_> *)*in_RSI);
    }
    uVar4 = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::Bucket::toBucketIndex
                          (&local_20,(Data<QHashPrivate::Node<QString,_QByteArray>_> *)*in_RSI);
    if (bVar2 == false) {
      in_stack_ffffffffffffff38 =
           QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::detached(d);
      pDVar3 = in_stack_ffffffffffffff38;
    }
    else {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::detached
                         (d,CONCAT17(uVar4,in_stack_ffffffffffffff50));
    }
    *in_RSI = (long)pDVar3;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::Bucket::Bucket
                (&local_30,(Data<QHashPrivate::Node<QString,_QByteArray>_> *)*in_RSI,bucket_00);
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::
                 findBucketWithHash<QString>(this_00,(QString *)in_RDI,(size_t)d);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff30 =
         QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::Bucket::insert
                   ((Bucket *)0x7957f8);
    QHashPrivate::Node<QString,_QByteArray>::createInPlace<>
              (in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
    *(long *)(*in_RSI + 8) = *(long *)(*in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::Bucket::toIterator
            ((Bucket *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  it.bucket = (size_t)in_stack_ffffffffffffff38;
  it.d = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)in_stack_ffffffffffffff30;
  QHash<QString,_QByteArray>::iterator::iterator((iterator *)in_stack_ffffffffffffff28,it);
  it_00.i.bucket = (size_t)in_stack_ffffffffffffff38;
  it_00.i.d = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)in_stack_ffffffffffffff30;
  QHash<QString,_QByteArray>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff28,it_00,false);
  QHash<QString,_QByteArray>::~QHash((QHash<QString,_QByteArray> *)in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)this_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }